

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O2

uint64_t roaring64_bitmap_range_cardinality(roaring64_bitmap_t *r,uint64_t min,uint64_t max)

{
  art_val_t *paVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  uint8_t min_high48 [6];
  uint8_t max_high48 [6];
  art_iterator_t it;
  uint local_c8;
  ushort local_c4;
  uint local_c0;
  ushort local_bc;
  art_iterator_t local_b8;
  
  if (min < max) {
    uVar3 = max - 1;
    local_c8 = (uint)(byte)(min >> 0x38) | ((uint)(min >> 0x20) & 0xff0000) >> 8 |
               (uint)(min >> 0x18) & 0xff0000 | (uint)(min >> 8) & 0xff000000;
    local_c4 = (ushort)(min >> 0x18) & 0xff | (ushort)(min >> 8) & 0xff00;
    local_c0 = (uint)(byte)(uVar3 >> 0x38) | (uint)((uVar3 & 0xff00000000ffff) >> 0x28) |
               (uint)(uVar3 >> 0x18) & 0xff0000 | (uint)(uVar3 >> 8) & 0xff000000;
    local_bc = (ushort)(uVar3 >> 0x18) & 0xff | (ushort)(uVar3 >> 8) & 0xff00;
    art_lower_bound(&local_b8,&r->art,(art_key_chunk_t *)&local_c8);
    uVar4 = 0;
    while (local_b8.value != (art_val_t *)0x0) {
      iVar2 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c0);
      paVar1 = local_b8.value;
      if (0 < iVar2) {
        return uVar4;
      }
      if (iVar2 == 0) {
        iVar2 = container_rank(*(container_t **)(local_b8.value[1].key + 2),local_b8.value[1].key[0]
                               ,(uint16_t)(uVar3 & 0xff00000000ffff));
      }
      else {
        iVar2 = container_get_cardinality
                          (*(container_t **)(local_b8.value[1].key + 2),local_b8.value[1].key[0]);
      }
      uVar4 = uVar4 + (long)iVar2;
      iVar2 = art_compare_keys(local_b8.key,(art_key_chunk_t *)&local_c8);
      if (((short)min != 0) && (iVar2 == 0)) {
        iVar2 = container_rank(*(container_t **)(paVar1[1].key + 2),paVar1[1].key[0],(short)min - 1)
        ;
        uVar4 = uVar4 - (long)iVar2;
      }
      art_iterator_next(&local_b8);
    }
  }
  else {
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

uint64_t roaring64_bitmap_range_cardinality(const roaring64_bitmap_t *r,
                                            uint64_t min, uint64_t max) {
    if (min >= max) {
        return 0;
    }
    max--;  // A closed range is easier to work with.

    uint64_t cardinality = 0;
    uint8_t min_high48[ART_KEY_BYTES];
    uint16_t min_low16 = split_key(min, min_high48);
    uint8_t max_high48[ART_KEY_BYTES];
    uint16_t max_low16 = split_key(max, max_high48);

    art_iterator_t it = art_lower_bound(&r->art, min_high48);
    while (it.value != NULL) {
        int max_compare_result = compare_high48(it.key, max_high48);
        if (max_compare_result > 0) {
            // We're outside the range.
            break;
        }

        leaf_t *leaf = (leaf_t *)it.value;
        if (max_compare_result == 0) {
            // We're at the max high key, add only the range up to the low
            // 16 bits of max.
            cardinality +=
                container_rank(leaf->container, leaf->typecode, max_low16);
        } else {
            // We're not yet at the max high key, add the full container
            // range.
            cardinality +=
                container_get_cardinality(leaf->container, leaf->typecode);
        }
        if (compare_high48(it.key, min_high48) == 0 && min_low16 > 0) {
            // We're at the min high key, remove the range up to the low 16
            // bits of min.
            cardinality -=
                container_rank(leaf->container, leaf->typecode, min_low16 - 1);
        }
        art_iterator_next(&it);
    }
    return cardinality;
}